

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void vocrevert(voccxdef *vctx)

{
  mcmodef *pmVar1;
  uint uVar2;
  voccxdef *in_RDI;
  objnum obj;
  int j;
  int i;
  vocidef **v;
  vocidef ***vpg;
  int in_stack_00000064;
  int in_stack_00000068;
  prpnum in_stack_0000006e;
  char *in_stack_00000070;
  objnum in_stack_0000007e;
  voccxdef *in_stack_00000080;
  int in_stack_00000090;
  objnum in_stack_ffffffffffffffce;
  voccxdef *in_stack_ffffffffffffffd0;
  ushort local_22;
  int local_20;
  int local_1c;
  vocidef **local_18;
  vocidef ***local_10;
  
  local_10 = in_RDI->voccxinh;
  for (local_1c = 0; local_1c < 0x80; local_1c = local_1c + 1) {
    if (*local_10 != (vocidef **)0x0) {
      local_18 = *local_10;
      local_22 = (ushort)(local_1c << 8);
      for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
        if (*local_18 != (vocidef *)0x0) {
          if ((((*local_18)->vociu).vocius.vociusflg & 0x10) == 0) {
            if ((in_RDI->voccxmem->mcmcxgl->mcmcxtab
                 [(int)(uint)in_RDI->voccxmem->mcmcxmtb[(int)(uint)local_22 >> 8]
                             [(int)(local_22 & 0xff)] >> 8]
                 [(int)(in_RDI->voccxmem->mcmcxmtb[(int)(uint)local_22 >> 8][(int)(local_22 & 0xff)]
                       & 0xff)].mcmoflg & 8) == 0) {
              pmVar1 = in_RDI->voccxmem->mcmcxgl->mcmcxtab
                       [(int)(uint)in_RDI->voccxmem->mcmcxmtb[(int)(uint)local_22 >> 8]
                                   [(int)(local_22 & 0xff)] >> 8];
              uVar2 = in_RDI->voccxmem->mcmcxmtb[(int)(uint)local_22 >> 8][(int)(local_22 & 0xff)] &
                      0xff;
              pmVar1[(int)uVar2].mcmoflg = pmVar1[(int)uVar2].mcmoflg | 0x100;
            }
            else {
              (*in_RDI->voccxmem->mcmcxrvf)(in_RDI->voccxmem->mcmcxrvc,local_22);
            }
          }
          else {
            vocidel(in_RDI,local_22);
            vocdel(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
            mcmfre((mcmcxdef *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
          }
        }
        local_18 = local_18 + 1;
        local_22 = local_22 + 1;
      }
    }
    local_10 = local_10 + 1;
  }
  vocdel1(in_stack_00000080,in_stack_0000007e,in_stack_00000070,in_stack_0000006e,in_stack_00000068,
          in_stack_00000064,in_stack_00000090);
  return;
}

Assistant:

void vocrevert(voccxdef *vctx)
{
    vocidef ***vpg;
    vocidef  **v;
    int        i;
    int        j;
    objnum     obj;

    /*
     *   Go through the inheritance records.  Delete each dynamically
     *   allocated object, and revert each static object to its original
     *   load state. 
     */
    for (vpg = vctx->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (*v)
            {
                /* if the object was dynamically allocated, delete it */
                if ((*v)->vociflg & VOCIFNEW)
                {
                    /* delete vocabulary and inheritance data for the object */
                    vocidel(vctx, obj);
                    vocdel(vctx, obj);

                    /* delete the object */
                    mcmfre(vctx->voccxmem, (mcmon)obj);
                }
                else
                {
                    /* revert the object */
                    mcmrevert(vctx->voccxmem, (mcmon)obj);
                }
            }
        }
    }

    /*
     *   Revert the vocabulary list: delete all newly added words, and
     *   undelete all original words marked as deleted.  
     */
    vocdel1(vctx, MCMONINV, (char *)0, 0, TRUE, TRUE, FALSE);
}